

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_compute_color_stats
               (LodePNGColorStats *stats,uchar *in,uint w,uint h,LodePNGColorMode *mode_in)

{
  undefined2 uVar1;
  undefined2 uVar2;
  LodePNGColorType LVar3;
  byte r_00;
  byte a_00;
  uint uVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  undefined1 uVar8;
  byte bVar9;
  undefined4 uVar10;
  byte bVar11;
  ulong uVar12;
  size_t sVar13;
  uint uVar14;
  byte bVar15;
  byte bVar16;
  bool bVar17;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  unsigned_short a;
  uint local_118;
  byte local_113;
  byte local_112;
  undefined1 local_111;
  LodePNGColorStats *local_110;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  LodePNGColorMode *local_f0;
  size_t local_e8;
  uchar *local_e0;
  undefined4 local_d8;
  uint local_d4;
  ulong local_d0;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  ColorTree tree;
  
  local_e8 = (ulong)h * (ulong)w;
  LVar3 = mode_in->colortype;
  local_e0 = in;
  local_118 = lodepng_can_have_alpha(mode_in);
  local_118 = local_118 ^ 1;
  local_f0 = mode_in;
  local_f8 = lodepng_get_bpp(mode_in);
  uVar4 = stats->bits;
  local_100 = CONCAT31(local_100._1_3_,local_f8 == 1 && uVar4 == 1);
  local_c4 = 0x101;
  if ((local_f8 < 9) &&
     (local_c4 = (1 << ((byte)local_f8 & 0x1f)) + stats->numcolors, 0x100 < local_c4)) {
    local_c4 = 0x101;
  }
  bVar16 = (LVar3 & ~LCT_GREY_ALPHA) == LCT_GREY;
  stats->numpixels = stats->numpixels + local_e8;
  uVar14 = stats->allow_palette;
  color_tree_init(&tree);
  if (stats->alpha != 0) {
    local_118 = 1;
  }
  uVar7 = stats->colored;
  bVar15 = local_f8 <= uVar4;
  local_d0 = (ulong)stats->numcolors;
  bVar17 = (uVar4 == 0x10 || uVar14 == 0) || local_c4 <= stats->numcolors;
  local_108 = CONCAT31(local_108._1_3_,bVar17);
  if (bVar17) {
LAB_001b7667:
    local_104 = (uint)(uVar7 != 0 | bVar16);
    local_110 = stats;
    if (local_f0->bitdepth == 0x10) {
      local_f4 = CONCAT31(local_f4._1_3_,bVar15);
      r = 0;
      g = 0;
      b = 0;
      a = 0;
      sVar13 = 0;
      do {
        if (local_e8 == sVar13) {
          bVar15 = (byte)local_f4;
          goto LAB_001b792c;
        }
        getPixelColorRGBA16(&r,&g,&b,&a,local_e0,sVar13,local_f0);
      } while ((((r & 0xff) == r >> 8) && ((g & 0xff) == g >> 8)) &&
              (((b & 0xff) == b >> 8 && (sVar13 = sVar13 + 1, (a & 0xff) == a >> 8))));
      stats->bits = 0x10;
      r = 0;
      g = 0;
      b = 0;
      a = 0;
      sVar13 = 0;
      uVar4 = local_104;
      uVar14 = local_118;
      do {
        if (local_e8 == sVar13) break;
        getPixelColorRGBA16(&r,&g,&b,&a,local_e0,sVar13,local_f0);
        bVar16 = 1;
        bVar17 = uVar4 == 0;
        uVar7 = 1;
        uVar4 = uVar7;
        if (bVar17) {
          if (r == g) {
            bVar16 = 0;
            uVar4 = 0;
            if (r == b) goto LAB_001b77c8;
          }
          stats->colored = 1;
          bVar16 = 1;
          uVar4 = uVar7;
        }
LAB_001b77c8:
        if (uVar14 == 0) {
          if ((r == stats->key_r) && (g == stats->key_g)) {
            bVar17 = b == stats->key_b;
          }
          else {
            bVar17 = false;
          }
          if (a == 0xffff) {
            bVar15 = 0;
            uVar14 = 0;
            if ((bool)(stats->key != 0 & bVar17)) goto LAB_001b7861;
          }
          else {
            if ((a != 0) || (!(bool)(stats->key == 0 | bVar17))) {
LAB_001b7861:
              stats->alpha = 1;
              stats->key = 0;
              goto LAB_001b786e;
            }
            bVar15 = 0;
            uVar14 = 0;
            if (stats->key == 0 && stats->alpha == 0) {
              stats->key = 1;
              stats->key_r = r;
              stats->key_g = g;
              stats->key_b = b;
              bVar15 = 0;
            }
          }
        }
        else {
LAB_001b786e:
          bVar15 = 1;
          uVar14 = uVar7;
        }
        sVar13 = sVar13 + 1;
      } while (!(bool)(bVar16 & bVar15));
      if ((stats->key != 0) && (local_110->alpha == 0)) {
        for (sVar13 = 0; local_e8 != sVar13; sVar13 = sVar13 + 1) {
          getPixelColorRGBA16(&r,&g,&b,&a,local_e0,sVar13,local_f0);
          if ((((a != 0) && (r == local_110->key_r)) && (g == local_110->key_g)) &&
             (b == local_110->key_b)) {
            local_110->alpha = 1;
            local_110->key = 0;
          }
        }
      }
    }
    else {
LAB_001b792c:
      local_100 = (uint)(bVar15 | (byte)local_100);
      local_108 = local_108 & 0xff;
      bVar11 = 0;
      r = r & 0xff00;
      g = g & 0xff00;
      b = b & 0xff00;
      a = a & 0xff00;
      bVar9 = 0;
      bVar16 = 0;
      bVar15 = 0;
      for (sVar13 = 0; local_e8 != sVar13; sVar13 = sVar13 + 1) {
        getPixelColorRGBA8((uchar *)&r,(uchar *)&g,(uchar *)&b,(uchar *)&a,local_e0,sVar13,local_f0)
        ;
        r_00 = (byte)r;
        a_00 = (byte)a;
        if (((byte)a != bVar15 || ((byte)b != bVar16 || ((byte)g != bVar9 || (byte)r != bVar11))) ||
            sVar13 == 0) {
          local_fc = local_110->bits;
          if (local_fc < 8 && local_100 == 0) {
            uVar4 = 1;
            if ((1 < (byte)((byte)r + 1)) && (uVar4 = 8, (byte)r % 0x11 == 0)) {
              uVar4 = (uint)((byte)r % 0x55 != 0) * 2 + 2;
            }
            if (local_fc < uVar4) {
              local_110->bits = uVar4;
              local_fc = uVar4;
            }
          }
          uVar14 = 1;
          local_100 = 0;
          bVar6 = 1;
          bVar17 = local_104 == 0;
          uVar4 = local_fc;
          local_104 = uVar14;
          if (bVar17) {
            bVar6 = 0;
            local_104 = 0;
            if ((byte)r != (byte)b || (byte)r != (byte)g) {
              local_110->colored = 1;
              bVar6 = 1;
              local_104 = uVar14;
              if (local_fc < 8) {
                local_110->bits = 8;
                uVar4 = 8;
                bVar6 = 1;
              }
            }
          }
          local_f4 = (uint)(byte)a;
          local_d4 = (uint)(byte)r;
          if (local_118 == 0) {
            if ((local_110->key_r == (r & 0xff)) && (local_110->key_g == (g & 0xff))) {
              bVar17 = local_110->key_b == (b & 0xff);
            }
            else {
              bVar17 = false;
            }
            if (local_f4 == 0xff) {
              uVar10 = 0;
              local_118 = 0;
              if ((bool)(local_110->key != 0 & bVar17)) {
                local_110->alpha = 1;
                local_110->key = 0;
                if (uVar4 < 8) {
                  local_110->bits = 8;
                }
                uVar10 = 1;
                local_118 = 1;
              }
            }
            else if ((local_f4 == 0) && ((bool)(local_110->key == 0 | bVar17))) {
              uVar10 = 0;
              local_118 = 0;
              if (local_110->key == 0 && local_110->alpha == 0) {
                local_110->key = 1;
                local_110->key_r = r & 0xff;
                local_110->key_g = g & 0xff;
                local_110->key_b = b & 0xff;
                uVar10 = 0;
                local_118 = 0;
              }
            }
            else {
              local_110->alpha = 1;
              local_110->key = 0;
              if (uVar4 < 8) {
                local_110->bits = 8;
              }
              local_118 = 1;
              uVar10 = 1;
            }
          }
          else {
            uVar10 = 1;
            local_118 = 1;
          }
          if (local_108 == 0) {
            local_108 = (uint)(byte)a;
            local_112 = (byte)b;
            local_113 = (byte)g;
            local_111 = local_f8 <= local_fc;
            local_d8 = uVar10;
            local_c0 = (uint)(byte)b;
            local_bc = (uint)(byte)g;
            iVar5 = color_tree_get(&tree,(byte)r,(byte)g,(byte)b,(byte)a);
            if (iVar5 < 0) {
              uVar4 = color_tree_add(&tree,r_00,(uchar)local_bc,(uchar)local_c0,a_00,(uint)local_d0)
              ;
              if (uVar4 != 0) goto LAB_001b7dac;
              uVar4 = local_110->numcolors;
              if ((ulong)uVar4 < 0x100) {
                uVar12 = (ulong)(uVar4 * 4);
                local_110->palette[(ulong)uVar4 * 4] = r_00;
                local_110->palette[uVar12 + 1] = local_113;
                local_110->palette[uVar12 + 2] = local_112;
                local_110->palette[uVar12 + 3] = (byte)local_108;
              }
              uVar4 = uVar4 + 1;
              local_d0 = (ulong)uVar4;
              local_110->numcolors = uVar4;
              uVar14 = (uint)(local_c4 <= uVar4);
              bVar16 = local_112;
              bVar15 = (byte)local_108;
              uVar7 = local_fc;
              uVar8 = local_111;
              uVar10 = local_d8;
              bVar9 = local_113;
            }
            else {
              uVar14 = 0;
              bVar16 = local_112;
              bVar15 = (byte)local_108;
              uVar7 = local_fc;
              uVar8 = local_111;
              uVar10 = local_d8;
              bVar9 = local_113;
            }
          }
          else {
            uVar14 = 1;
            bVar16 = (byte)b;
            bVar15 = (byte)a;
            uVar7 = local_fc;
            uVar8 = local_f8 <= local_fc;
            bVar9 = (byte)g;
            local_fc = uVar4;
          }
          local_100 = CONCAT31((int3)(local_100 >> 8),uVar8);
          local_108 = uVar14;
          bVar11 = r_00;
          if (((bVar6 & (byte)uVar10 & uVar14 != 0) == 1) && (local_f8 <= uVar7)) break;
        }
      }
      if ((local_110->key != 0) && (local_110->alpha == 0)) {
        for (sVar13 = 0; local_e8 != sVar13; sVar13 = sVar13 + 1) {
          getPixelColorRGBA8((uchar *)&r,(uchar *)&g,(uchar *)&b,(uchar *)&a,local_e0,sVar13,
                             local_f0);
          if (((((byte)a != '\0') && (local_110->key_r == (r & 0xff))) &&
              (local_110->key_g == (g & 0xff))) && (local_110->key_b == (b & 0xff))) {
            local_110->alpha = 1;
            local_110->key = 0;
            if (local_110->bits < 8) {
              local_110->bits = 8;
            }
          }
        }
      }
      uVar1 = local_110->key_r;
      uVar2 = local_110->key_g;
      local_110->key_r = uVar1 * 0x101;
      local_110->key_g = uVar2 * 0x101;
      local_110->key_b = (short)*(undefined4 *)&local_110->key_b * 0x101;
    }
    uVar4 = 0;
  }
  else {
    local_104 = CONCAT31(local_104._1_3_,bVar16);
    uVar12 = 0;
    do {
      if (stats->numcolors <= uVar12) {
        bVar16 = (byte)local_104;
        local_d0 = (ulong)stats->numcolors;
        goto LAB_001b7667;
      }
      uVar4 = color_tree_add(&tree,stats->palette[uVar12 * 4],stats->palette[uVar12 * 4 + 1],
                             stats->palette[uVar12 * 4 + 2],stats->palette[uVar12 * 4 + 3],
                             (uint)uVar12);
      uVar12 = uVar12 + 1;
    } while (uVar4 == 0);
  }
LAB_001b7dac:
  color_tree_cleanup(&tree);
  return uVar4;
}

Assistant:

unsigned lodepng_compute_color_stats(LodePNGColorStats* stats,
                                     const unsigned char* in, unsigned w, unsigned h,
                                     const LodePNGColorMode* mode_in) {
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;
  unsigned error = 0;

  /* mark things as done already if it would be impossible to have a more expensive case */
  unsigned colored_done = lodepng_is_greyscale_type(mode_in) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode_in) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode_in);
  unsigned bits_done = (stats->bits == 1 && bpp == 1) ? 1 : 0;
  unsigned sixteen = 0; /* whether the input image is 16 bit */
  unsigned maxnumcolors = 257;
  if(bpp <= 8) maxnumcolors = LODEPNG_MIN(257, stats->numcolors + (1u << bpp));

  stats->numpixels += numpixels;

  /*if palette not allowed, no need to compute numcolors*/
  if(!stats->allow_palette) numcolors_done = 1;

  color_tree_init(&tree);

  /*If the stats was already filled in from previous data, fill its palette in tree
  and mark things as done already if we know they are the most expensive case already*/
  if(stats->alpha) alpha_done = 1;
  if(stats->colored) colored_done = 1;
  if(stats->bits == 16) numcolors_done = 1;
  if(stats->bits >= bpp) bits_done = 1;
  if(stats->numcolors >= maxnumcolors) numcolors_done = 1;

  if(!numcolors_done) {
    for(i = 0; i < stats->numcolors; i++) {
      const unsigned char* color = &stats->palette[i * 4];
      error = color_tree_add(&tree, color[0], color[1], color[2], color[3], (unsigned)i);
      if(error) goto cleanup;
    }
  }

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode_in->bitdepth == 16 && !sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/ {
        stats->bits = 16;
        sixteen = 1;
        bits_done = 1;
        numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/
        break;
      }
    }
  }

  if(sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;

    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);

      if(!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if(a != 65535 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        } else if(a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        } else if(a == 65535 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(stats->key && !stats->alpha) {
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
    }
  } else /* < 16-bit */ {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    unsigned char pr = 0, pg = 0, pb = 0, pa = 0;
    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);

      /*skip if color same as before, this speeds up large non-photographic
      images with many same colors by avoiding 'color_tree_has' below */
      if(i != 0 && r == pr && g == pg && b == pb && a == pa) continue;
      pr = r;
      pg = g;
      pb = b;
      pa = a;

      if(!bits_done && stats->bits < 8) {
        /*only r is checked, < 8 bits is only relevant for grayscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > stats->bits) stats->bits = bits;
      }
      bits_done = (stats->bits >= bpp);

      if(!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
        if(stats->bits < 8) stats->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if(a != 255 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        } else if(a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        } else if(a == 255 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done) {
        if(!color_tree_has(&tree, r, g, b, a)) {
          error = color_tree_add(&tree, r, g, b, a, stats->numcolors);
          if(error) goto cleanup;
          if(stats->numcolors < 256) {
            unsigned char* p = stats->palette;
            unsigned n = stats->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++stats->numcolors;
          numcolors_done = stats->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(stats->key && !stats->alpha) {
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }
    }

    /*make the stats's key always 16-bit for consistency - repeat each byte twice*/
    stats->key_r += (stats->key_r << 8);
    stats->key_g += (stats->key_g << 8);
    stats->key_b += (stats->key_b << 8);
  }

cleanup:
  color_tree_cleanup(&tree);
  return error;
}